

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

int testing::internal::
    CountIf<std::vector<testing::TestPartResult,std::allocator<testing::TestPartResult>>,bool(*)(testing::TestPartResult_const&)>
              (vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_> *c,
              _func_bool_TestPartResult_ptr *predicate)

{
  bool bVar1;
  reference pTVar2;
  long in_FS_OFFSET;
  int local_34;
  int count;
  _func_bool_TestPartResult_ptr *predicate_local;
  vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_> *c_local;
  __normal_iterator<const_testing::TestPartResult_*,_std::vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>_>
  local_18;
  const_iterator it;
  
  it._M_current = *(TestPartResult **)(in_FS_OFFSET + 0x28);
  local_34 = 0;
  local_18._M_current =
       (TestPartResult *)
       std::vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>::begin(c);
  while( true ) {
    c_local = (vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_> *)
              std::vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>::end(c)
    ;
    bVar1 = __gnu_cxx::operator!=
                      (&local_18,
                       (__normal_iterator<const_testing::TestPartResult_*,_std::vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>_>
                        *)&c_local);
    if (!bVar1) break;
    pTVar2 = __gnu_cxx::
             __normal_iterator<const_testing::TestPartResult_*,_std::vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>_>
             ::operator*(&local_18);
    bVar1 = (*predicate)(pTVar2);
    if (bVar1) {
      local_34 = local_34 + 1;
    }
    __gnu_cxx::
    __normal_iterator<const_testing::TestPartResult_*,_std::vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>_>
    ::operator++(&local_18);
  }
  if (*(TestPartResult **)(in_FS_OFFSET + 0x28) != it._M_current) {
    __stack_chk_fail();
  }
  return local_34;
}

Assistant:

inline int CountIf(const Container& c, Predicate predicate) {
  // Implemented as an explicit loop since std::count_if() in libCstd on
  // Solaris has a non-standard signature.
  int count = 0;
  for (typename Container::const_iterator it = c.begin(); it != c.end(); ++it) {
    if (predicate(*it))
      ++count;
  }
  return count;
}